

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::chooseRightTextInputWidget(QInputDialogPrivate *this)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QInputDialog::InputDialogOption> QVar3;
  Int IVar4;
  QComboBox *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  InputDialogOption in_stack_ffffffffffffff9c;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar5;
  QInputDialogPrivate *this_00;
  QComboBox *this_01;
  QInputDialogPrivate *in_stack_ffffffffffffffc0;
  QInputDialogPrivate *in_stack_ffffffffffffffd0;
  QWidget *in_stack_ffffffffffffffd8;
  QInputDialogPrivate *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = useComboBoxOrListView
                    ((QInputDialogPrivate *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar2) {
    QVar3.i = (Int)QFlags<QInputDialog::InputDialogOption>::operator&
                             ((QFlags<QInputDialog::InputDialogOption> *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff9c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff4);
    bVar5 = 0;
    if (IVar4 != 0) {
      bVar2 = QComboBox::isEditable((QComboBox *)(ulong)in_stack_ffffffffffffffa0);
      bVar5 = bVar2 ^ 0xff;
    }
    if ((bVar5 & 1) == 0) {
      this_00 = *(QInputDialogPrivate **)((long)(in_RDI + 0x13) + 0x18);
    }
    else {
      ensureListView((QInputDialogPrivate *)CONCAT44(QVar3.i,in_stack_fffffffffffffff0));
      this_00 = *(QInputDialogPrivate **)((long)(in_RDI + 0x13) + 0x20);
    }
  }
  else {
    QFlags<QInputDialog::InputDialogOption>::operator&
              ((QFlags<QInputDialog::InputDialogOption> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff0);
    if (IVar4 == 0) {
      ensureLineEdit(in_stack_ffffffffffffffd0);
      this_00 = (QInputDialogPrivate *)in_RDI[0x12].super_QWidget.data;
    }
    else {
      ensurePlainTextEdit(in_stack_ffffffffffffffd0);
      this_00 = *(QInputDialogPrivate **)(in_RDI + 0x13);
    }
  }
  setInputWidget(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*(char16_t **)(in_RDI + 0x14) == *(char16_t **)((long)(in_RDI + 0x13) + 0x18)) {
    QComboBox::currentText(this_01);
    textChanged(this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x79bcba);
  }
  else if (*(char16_t **)(in_RDI + 0x14) == *(char16_t **)((long)(in_RDI + 0x13) + 0x20)) {
    listViewText(in_stack_ffffffffffffffc0);
    textChanged(this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x79bcf9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialogPrivate::chooseRightTextInputWidget()
{
    QWidget *widget;

    if (useComboBoxOrListView()) {
        if ((opts & QInputDialog::UseListViewForComboBoxItems) && !comboBox->isEditable()) {
            ensureListView();
            widget = listView;
        } else {
            widget = comboBox;
        }
    } else if (opts & QInputDialog::UsePlainTextEditForTextInput) {
        ensurePlainTextEdit();
        widget = plainTextEdit;
    } else {
        ensureLineEdit();
        widget = lineEdit;
    }

    setInputWidget(widget);

    if (inputWidget == comboBox) {
        textChanged(comboBox->currentText());
    } else if (inputWidget == listView) {
        textChanged(listViewText());
    }
}